

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O2

void homeDir(char **dir,uint *dirLength)

{
  char *__s;
  uchar uVar1;
  __uid_t __uid;
  passwd *ppVar2;
  size_t sVar3;
  char *home;
  uint homeLen;
  
  uVar1 = checkStringOutParameter(dir,dirLength);
  if (uVar1 != '\0') {
    getEnv("HOME",4,&home,&homeLen);
    if (homeLen == 0 || home == (char *)0x0) {
      free(home);
      __uid = getuid();
      ppVar2 = getpwuid(__uid);
      if (ppVar2 == (passwd *)0x0) {
        invalidateStringOutParameter(dir,dirLength);
      }
      else {
        __s = ppVar2->pw_dir;
        sVar3 = strlen(__s);
        copyToStringOutParameter(__s,(uint)sVar3,dir,dirLength);
      }
    }
    else {
      copyToStringOutParameter(home,homeLen,dir,dirLength);
      free(home);
    }
  }
  return;
}

Assistant:

void homeDir(char ** dir, unsigned int * dirLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(dir, dirLength))
    {
        return;
    }

    #ifdef SYSTEM_WINDOWS

        char * homeDrive, * homePath;
        unsigned int homeDriveLen, homePathLen;
        getEnv("HOMEDRIVE", 9, &homeDrive, &homeDriveLen);
        getEnv("HOMEPATH", 8, &homePath, &homePathLen);

        unsigned int homeLen = homeDriveLen + homePathLen;
        char * home = (char *)malloc(sizeof(char) * homeLen);
        memcpy(home, homeDrive, homeDriveLen);
        memcpy(home + homeDriveLen, homePath, homePathLen);

        copyToStringOutParameter(home, homeLen, dir, dirLength);

        free(homePath);
        free(homeDrive);

    #else // every other UNIX, including Linux and macOS

        char * home;
        unsigned int homeLen;

        // First, test
        getEnv("HOME", 4, &home, &homeLen);

        if (home != 0x0 && homeLen > 0) {
            copyToStringOutParameter(home, homeLen, dir, dirLength);

            free(home);

            return;
        }

        free(home);

        // Fallback using UNIX passwd structure for the current user
        struct passwd* pwd = getpwuid(getuid());

        if (pwd != 0x0)
        {
            copyToStringOutParameter(pwd->pw_dir, strlen(pwd->pw_dir), dir, dirLength);

            return;
        }

        // No home directory was found
        invalidateStringOutParameter(dir, dirLength);

    #endif

}